

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

void __thiscall qpdf::BaseHandle::disconnect(BaseHandle *this,bool only_direct)

{
  byte bVar1;
  element_type *peVar2;
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var3;
  _Head_base<0UL,_QPDF_Stream::Members_*,_false> _Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  BaseHandle *pBVar5;
  variant_alternative_t<8UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar6;
  _Rb_tree_node_base *p_Var7;
  variant_alternative_t<10UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar8;
  variant_alternative_t<9UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar9;
  undefined7 in_register_00000031;
  QPDFObjectHandle *oh;
  BaseHandle *this_01;
  
  peVar2 = (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((int)CONCAT71(in_register_00000031,only_direct) == 0) {
    if (peVar2 == (element_type *)0x0) {
      return;
    }
  }
  else {
    if (peVar2 == (element_type *)0x0) {
      return;
    }
    if ((peVar2->og).obj != 0) {
      return;
    }
  }
  bVar1 = (peVar2->value).
          super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          .
          super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          .
          super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          .
          super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          .
          super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          .
          super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          ._M_index;
  if (bVar1 < 9) {
    if (bVar1 == 0) {
      return;
    }
    if (bVar1 == 8) {
      pvVar6 = std::
               get<8ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         (&peVar2->value);
      _Var3._M_head_impl =
           (pvVar6->sp)._M_t.
           super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
           super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
           super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
      if (_Var3._M_head_impl == (Sparse *)0x0) {
        pBVar5 = &((pvVar6->elements).
                   super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                   super__Vector_impl_data._M_finish)->super_BaseHandle;
        for (this_01 = &((pvVar6->elements).
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_start)->super_BaseHandle;
            this_01 != pBVar5; this_01 = this_01 + 1) {
          disconnect(this_01,true);
        }
      }
      else {
        for (p_Var7 = *(_Base_ptr *)((long)&(_Var3._M_head_impl)->elements + 0x18);
            (_Rb_tree_header *)p_Var7 !=
            (_Rb_tree_header *)((long)&(_Var3._M_head_impl)->elements + 8U);
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          disconnect((BaseHandle *)&p_Var7[1]._M_parent,true);
        }
      }
    }
  }
  else if (bVar1 == 9) {
    pvVar9 = std::
             get<9ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&peVar2->value);
    for (p_Var7 = (pvVar9->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(pvVar9->items)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      disconnect((BaseHandle *)(p_Var7 + 2),true);
    }
  }
  else if (bVar1 == 10) {
    pvVar8 = std::
             get<10ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&peVar2->value);
    _Var4._M_head_impl =
         (pvVar8->m)._M_t.
         super___uniq_ptr_impl<QPDF_Stream::Members,_std::default_delete<QPDF_Stream::Members>_>.
         _M_t.
         super__Tuple_impl<0UL,_QPDF_Stream::Members_*,_std::default_delete<QPDF_Stream::Members>_>.
         super__Head_base<0UL,_QPDF_Stream::Members_*,_false>._M_head_impl;
    ((_Var4._M_head_impl)->stream_provider).
    super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
    this_00._M_pi =
         ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(_Var4._M_head_impl)->stream_provider + 8))->_M_pi;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(_Var4._M_head_impl)->stream_provider + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
    disconnect(&(((pvVar8->m)._M_t.
                  super___uniq_ptr_impl<QPDF_Stream::Members,_std::default_delete<QPDF_Stream::Members>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_QPDF_Stream::Members_*,_std::default_delete<QPDF_Stream::Members>_>
                  .super__Head_base<0UL,_QPDF_Stream::Members_*,_false>._M_head_impl)->stream_dict).
                super_BaseHandle,true);
  }
  peVar2 = (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2->qpdf = (QPDF *)0x0;
  (peVar2->og).obj = 0;
  (peVar2->og).gen = 0;
  return;
}

Assistant:

void
BaseHandle::disconnect(bool only_direct)
{
    // QPDF::~QPDF() calls disconnect for indirect objects, so we don't do that here.
    if (only_direct && indirect()) {
        return;
    }

    switch (raw_type_code()) {
    case ::ot_array:
        {
            auto& a = std::get<QPDF_Array>(obj->value);
            if (a.sp) {
                for (auto& item: a.sp->elements) {
                    item.second.disconnect();
                }
            } else {
                for (auto& oh: a.elements) {
                    oh.disconnect();
                }
            }
        }
        break;
    case ::ot_dictionary:
        for (auto& iter: std::get<QPDF_Dictionary>(obj->value).items) {
            iter.second.disconnect();
        }
        break;
    case ::ot_stream:
        {
            auto& s = std::get<QPDF_Stream>(obj->value);
            s.m->stream_provider = nullptr;
            s.m->stream_dict.disconnect();
        }
        break;
    case ::ot_uninitialized:
        return;
    default:
        break;
    }
    obj->qpdf = nullptr;
    obj->og = QPDFObjGen();
}